

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::ConsoleReporter::assertionEnded(ConsoleReporter *this,AssertionStats *_assertionStats)

{
  byte bVar1;
  bool bVar2;
  OfType OVar3;
  ostream *this_00;
  AssertionResult *in_RSI;
  long in_RDI;
  ConsoleAssertionPrinter printer;
  bool includeResults;
  AssertionResult *result;
  bool in_stack_00000107;
  ColourImpl *in_stack_00000108;
  AssertionStats *in_stack_00000110;
  ostream *in_stack_00000118;
  ConsoleAssertionPrinter *in_stack_00000120;
  ConsoleReporter *in_stack_ffffffffffffff70;
  byte local_79;
  
  bVar1 = (**(code **)(**(long **)(in_RDI + 0x10) + 0x20))();
  local_79 = 1;
  if ((bVar1 & 1) == 0) {
    bVar2 = AssertionResult::isOk((AssertionResult *)in_stack_ffffffffffffff70);
    local_79 = bVar2 ^ 0xff;
  }
  if ((((local_79 & 1) != 0) || (OVar3 = AssertionResult::getResultType(in_RSI), OVar3 == Warning))
     || (OVar3 = AssertionResult::getResultType(in_RSI), OVar3 == ExplicitSkip)) {
    lazyPrint(in_stack_ffffffffffffff70);
    Detail::unique_ptr<Catch::ColourImpl>::get((unique_ptr<Catch::ColourImpl> *)(in_RDI + 0x28));
    anon_unknown_26::ConsoleAssertionPrinter::ConsoleAssertionPrinter
              (in_stack_00000120,in_stack_00000118,in_stack_00000110,in_stack_00000108,
               in_stack_00000107);
    anon_unknown_26::ConsoleAssertionPrinter::print((ConsoleAssertionPrinter *)in_RSI);
    this_00 = std::operator<<(*(ostream **)(in_RDI + 0x20),'\n');
    std::ostream::operator<<(this_00,std::flush<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void ConsoleReporter::assertionEnded(AssertionStats const& _assertionStats) {
    AssertionResult const& result = _assertionStats.assertionResult;

    bool includeResults = m_config->includeSuccessfulResults() || !result.isOk();

    // Drop out if result was successful but we're not printing them.
    // TODO: Make configurable whether skips should be printed
    if (!includeResults && result.getResultType() != ResultWas::Warning && result.getResultType() != ResultWas::ExplicitSkip)
        return;

    lazyPrint();

    ConsoleAssertionPrinter printer(m_stream, _assertionStats, m_colour.get(), includeResults);
    printer.print();
    m_stream << '\n' << std::flush;
}